

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O3

void was_supplied_test_invoker(void)

{
  undefined8 uVar1;
  ios_base *this;
  string local_288;
  undefined7 uStack_287;
  undefined1 local_278 [16];
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 local_218 [376];
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_220 = "";
  memset((ostringstream *)local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"was_supplied_test",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_40 = local_a0;
  local_38 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0xf8);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_230 = "";
  memset((ostringstream *)local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"was_supplied_test",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_50 = local_a0;
  local_48 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0xf8);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_240 = "";
  memset((ostringstream *)local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"was_supplied_test",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_60 = local_a0;
  local_58 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0xf8);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  this = (ios_base *)(local_218 + 0x70);
  std::ios_base::~ios_base(this);
  was_supplied_test::test_method((was_supplied_test *)this);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_250 = "";
  memset((ostringstream *)local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"was_supplied_test",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_70 = local_a0;
  local_68 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0xf8);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_260 = "";
  memset((ostringstream *)local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"was_supplied_test",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_80 = local_a0;
  local_78 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0xf8);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(was_supplied_test) {
  int int_opt;
  std::string str_opt;
  bool bool_opt;

  char command_line[] = "exe --int_opt 3 --str_opt test";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group1");
  arg_group.add(make_option("int_opt", int_opt));
  arg_group.add(make_option("str_opt", str_opt));
  arg_group.add(make_option("bool_opt", bool_opt));

  BOOST_CHECK_NO_THROW(options->add_and_parse(arg_group));
  BOOST_CHECK_EQUAL(int_opt, 3);
  BOOST_CHECK_EQUAL(str_opt, "test");
  BOOST_CHECK_EQUAL(bool_opt, false);

  BOOST_CHECK_EQUAL(options->was_supplied("int_opt"), true);
  BOOST_CHECK_EQUAL(options->was_supplied("str_opt"), true);
  BOOST_CHECK_EQUAL(options->was_supplied("bool_opt"), false);
  BOOST_CHECK_EQUAL(options->was_supplied("other_opt"), false);
}